

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O1

bool32 rw::d3d::rasterFromImage(Raster *raster,Image *image)

{
  uint uVar1;
  int iVar2;
  Image *this;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint8 *puVar7;
  uint8 *puVar8;
  code *pcVar9;
  uint8 *local_50;
  
  if ((raster->type & 0xfU) != 4) {
    return 0;
  }
  this = (Image *)0x0;
  if ((image->depth < 9) && (isP8supported == 0)) {
    this = Image::create(image->width,image->height,image->depth);
    this->pixels = image->pixels;
    this->stride = image->stride;
    this->palette = image->palette;
    Image::unpalettize(this,false);
    image = this;
  }
  uVar1 = raster->format;
  uVar6 = uVar1 & 0x6f00;
  uVar3 = image->depth << 0x1e | image->depth - 4U >> 2;
  if (7 < uVar3) goto switchD_0011678b_caseD_2;
  lVar5 = (long)nativeRasterOffset;
  switch(uVar3) {
  case 0:
    pcVar9 = conv_8_from_8;
    if ((uVar6 != 0x2500) && (uVar6 != 0x4500)) break;
    goto LAB_00116808;
  case 1:
    if (uVar6 == 0x2500) {
      pcVar9 = conv_8_from_8;
      goto LAB_00116808;
    }
    break;
  case 3:
    if (uVar6 == 0x100) {
      pcVar9 = conv_ARGB1555_from_ARGB1555;
      goto LAB_00116808;
    }
    break;
  case 5:
    if (uVar6 == 0x500) {
      pcVar9 = conv_BGRA8888_from_RGB888;
      goto LAB_00116808;
    }
    goto LAB_001167d7;
  case 7:
    if (uVar6 == 0x500) {
      pcVar9 = conv_BGRA8888_from_RGBA8888;
      goto LAB_00116808;
    }
LAB_001167d7:
    if (uVar6 == 0x600) {
      pcVar9 = conv_BGR888_from_RGB888;
LAB_00116808:
      uVar3 = 0x10;
      if ((uVar1 >> 0xe & 1) == 0) {
        uVar3 = uVar1 >> 5 & 0x100;
      }
      if (uVar3 != 0 && (uVar1 & 0x6000) != 0) {
        puVar7 = *(uint8 **)((long)&raster->flags + lVar5);
        puVar8 = image->palette;
        do {
          conv_RGBA8888_from_RGBA8888(puVar7,puVar8);
          puVar8 = puVar8 + 4;
          puVar7 = puVar7 + 4;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      puVar7 = raster->pixels;
      if (puVar7 == (uint8 *)0x0) {
        Raster::lock(raster,0,5);
      }
      if (0 < image->height) {
        local_50 = raster->pixels;
        iVar2 = 0;
        do {
          if (0 < image->width) {
            iVar4 = 0;
            puVar8 = local_50;
            do {
              (*pcVar9)(puVar8);
              puVar8 = puVar8 + *(uint *)((long)&raster->depth + lVar5);
              iVar4 = iVar4 + 1;
            } while (iVar4 < image->width);
          }
          local_50 = local_50 + raster->stride;
          iVar2 = iVar2 + 1;
        } while (iVar2 < image->height);
      }
      if (puVar7 == (uint8 *)0x0) {
        Raster::unlock(raster,0);
      }
      if (this == (Image *)0x0) {
        return 1;
      }
      Image::destroy(this);
      return 1;
    }
  }
switchD_0011678b_caseD_2:
  rasterFromImage();
  return 0;
}

Assistant:

bool32
rasterFromImage(Raster *raster, Image *image)
{
	if((raster->type&0xF) != Raster::TEXTURE)
		return 0;

	void (*conv)(uint8 *out, uint8 *in) = nil;

	// Unpalettize image if necessary but don't change original
	Image *truecolimg = nil;
	if(image->depth <= 8 && !isP8supported){
		truecolimg = Image::create(image->width, image->height, image->depth);
		truecolimg->pixels = image->pixels;
		truecolimg->stride = image->stride;
		truecolimg->palette = image->palette;
		truecolimg->unpalettize();
		image = truecolimg;
	}

	D3dRaster *natras = GETD3DRASTEREXT(raster);
	int32 format = raster->format&(Raster::PAL8 | Raster::PAL4 | 0xF00);
	switch(image->depth){
	case 32:
		if(format == Raster::C8888)
			conv = conv_BGRA8888_from_RGBA8888;
		else if(format == Raster::C888)
			conv = conv_BGR888_from_RGB888;
		else
			goto err;
		break;
	case 24:
		if(format == Raster::C8888)
			conv = conv_BGRA8888_from_RGB888;
		else if(format == Raster::C888)
			conv = conv_BGR888_from_RGB888;
		else
			goto err;
		break;
	case 16:
		if(format == Raster::C1555)
			conv = conv_ARGB1555_from_ARGB1555;
		else
			goto err;
		break;
	case 8:
		if(format == (Raster::PAL8 | Raster::C8888))
			conv = conv_8_from_8;
		else
			goto err;
		break;
	case 4:
		if(format == (Raster::PAL4 | Raster::C8888) ||
		   format == (Raster::PAL8 | Raster::C8888))
			conv = conv_8_from_8;
		else
			goto err;
		break;
	default:
	err:
fprintf(stderr, "%d %x\n", image->depth, format); fflush(stdout);
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	uint8 *in, *out;
	int pallength = 0;
	if(raster->format & Raster::PAL4)
		pallength = 16;
	else if(raster->format & Raster::PAL8)
		pallength = 256;
	if(pallength){
		in = image->palette;
		out = (uint8*)natras->palette;
		for(int32 i = 0; i < pallength; i++){
			conv_RGBA8888_from_RGBA8888(out, in);
			in += 4;
			out += 4;
		}
	}

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		unlock = true;
	}

	uint8 *pixels = raster->pixels;
	assert(pixels);
	uint8 *imgpixels = image->pixels;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(rasrow, imgrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels += image->stride;
		pixels += raster->stride;
	}
	if(unlock)
		raster->unlock(0);

	if(truecolimg)
		truecolimg->destroy();

	return 1;
}